

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O0

void __thiscall Database::~Database(Database *this)

{
  Database *this_local;
  
  Close(this);
  Database_Result::~Database_Result(&this->callbackdata);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~list(&this->transaction_log);
  std::__cxx11::string::~string((string *)&this->db);
  std::__cxx11::string::~string((string *)&this->pass);
  std::__cxx11::string::~string((string *)&this->user);
  std::__cxx11::string::~string((string *)&this->host);
  std::unique_ptr<Database::impl_,_std::default_delete<Database::impl_>_>::~unique_ptr(&this->impl);
  return;
}

Assistant:

Database::~Database()
{
	this->Close();
}